

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMRangeImpl.cpp
# Opt level: O3

void __thiscall xercesc_4_0::DOMRangeImpl::insertNode(DOMRangeImpl *this,DOMNode *newNode)

{
  DOMDocument *pDVar1;
  XMLSize_t offset;
  DOMProcessingInstructionImpl *this_00;
  _func_int *UNRECOVERED_JUMPTABLE;
  uint uVar2;
  int iVar3;
  DOMNode *node;
  undefined4 extraout_var;
  long *plVar5;
  long lVar6;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  DOMNode *pDVar7;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  DOMException *this_01;
  code *pcVar8;
  pointer_____offset_0x10___ *ppuVar9;
  ulong uVar10;
  bool bVar11;
  DOMNode *pDVar4;
  undefined4 extraout_var_03;
  
  if (newNode == (DOMNode *)0x0) {
    return;
  }
  if (this->fDetached == true) {
    this_01 = (DOMException *)__cxa_allocate_exception(0x28);
    DOMException::DOMException(this_01,0xb,0,this->fMemoryManager);
  }
  else {
    uVar2 = (*newNode->_vptr_DOMNode[4])(newNode);
    if ((uVar2 < 0xd) && ((0x1244U >> (uVar2 & 0x1f) & 1) != 0)) {
      this_01 = (DOMException *)__cxa_allocate_exception(0x28);
      DOMRangeException::DOMRangeException((DOMRangeException *)this_01,0x70,0,this->fMemoryManager)
      ;
      ppuVar9 = &DOMRangeException::typeinfo;
      pcVar8 = DOMRangeException::~DOMRangeException;
      goto LAB_0027b239;
    }
    pDVar4 = this->fStartContainer;
    bVar11 = pDVar4 != (DOMNode *)0x0;
    if (pDVar4 != newNode && bVar11) {
      do {
        iVar3 = (*pDVar4->_vptr_DOMNode[5])(pDVar4);
        pDVar4 = (DOMNode *)CONCAT44(extraout_var,iVar3);
        bVar11 = pDVar4 != (DOMNode *)0x0;
        if (pDVar4 == newNode) break;
      } while (pDVar4 != (DOMNode *)0x0);
    }
    if (bVar11) {
      this_01 = (DOMException *)__cxa_allocate_exception(0x28);
      DOMException::DOMException(this_01,3,0,this->fMemoryManager);
    }
    else {
      pDVar4 = this->fStartContainer;
      while (pDVar4 != (DOMNode *)0x0) {
        plVar5 = (long *)__dynamic_cast(newNode,&DOMNode::typeinfo,&HasDOMNodeImpl::typeinfo,
                                        0xfffffffffffffffe);
        if ((plVar5 == (long *)0x0) || (lVar6 = (**(code **)(*plVar5 + 0x10))(plVar5), lVar6 == 0))
        {
          this_01 = (DOMException *)__cxa_allocate_exception(0x28);
          DOMException::DOMException(this_01,0xb,0,XMLPlatformUtils::fgMemoryManager);
          goto LAB_0027b22b;
        }
        lVar6 = (**(code **)(*plVar5 + 0x10))(plVar5);
        if ((*(ushort *)(lVar6 + 0x10) & 1) != 0) {
          this_01 = (DOMException *)__cxa_allocate_exception(0x28);
          DOMException::DOMException(this_01,7,0,this->fMemoryManager);
          goto LAB_0027b22b;
        }
        iVar3 = (*pDVar4->_vptr_DOMNode[5])(pDVar4);
        pDVar4 = (DOMNode *)CONCAT44(extraout_var_00,iVar3);
      }
      pDVar1 = this->fDocument;
      iVar3 = (*newNode->_vptr_DOMNode[0xc])(newNode);
      if (pDVar1 == (DOMDocument *)CONCAT44(extraout_var_01,iVar3)) {
        uVar2 = (*this->fStartContainer->_vptr_DOMNode[4])();
        if ((uVar2 < 9) && ((0x198U >> (uVar2 & 0x1f) & 1) != 0)) {
          iVar3 = (*this->fStartContainer->_vptr_DOMNode[5])();
          pDVar4 = (DOMNode *)CONCAT44(extraout_var_02,iVar3);
          offset = this->fStartOffset;
          if (offset != 0) {
            this_00 = (DOMProcessingInstructionImpl *)this->fStartContainer;
            if (uVar2 == 7) {
              DOMProcessingInstructionImpl::splitText(this_00,offset);
            }
            else if (uVar2 == 8) {
              DOMCommentImpl::splitText((DOMCommentImpl *)this_00,offset);
            }
            else {
              (*(this_00->super_DOMProcessingInstruction).super_DOMNode._vptr_DOMNode[0x30])();
            }
            if (this->fStartOffset != 0) {
              iVar3 = (*this->fStartContainer->_vptr_DOMNode[10])();
              pDVar7 = (DOMNode *)CONCAT44(extraout_var_05,iVar3);
              goto LAB_0027b189;
            }
          }
          pDVar7 = this->fStartContainer;
        }
        else {
          pDVar4 = this->fStartContainer;
          iVar3 = (*pDVar4->_vptr_DOMNode[7])(pDVar4);
          pDVar7 = (DOMNode *)CONCAT44(extraout_var_03,iVar3);
          if ((pDVar7 == (DOMNode *)0x0) || (this->fStartOffset == 0)) goto LAB_0027b18e;
          uVar10 = 1;
          do {
            iVar3 = (*pDVar7->_vptr_DOMNode[10])(pDVar7);
            pDVar7 = (DOMNode *)CONCAT44(extraout_var_04,iVar3);
            if (pDVar7 == (DOMNode *)0x0) break;
            bVar11 = uVar10 < this->fStartOffset;
            uVar10 = uVar10 + 1;
          } while (bVar11);
        }
LAB_0027b189:
        if (pDVar4 == (DOMNode *)0x0) {
          return;
        }
LAB_0027b18e:
        if (pDVar7 == (DOMNode *)0x0) {
          (*pDVar4->_vptr_DOMNode[0x11])(pDVar4,newNode);
          return;
        }
        UNRECOVERED_JUMPTABLE = pDVar4->_vptr_DOMNode[0xe];
        (*UNRECOVERED_JUMPTABLE)(pDVar4,newNode,pDVar7,UNRECOVERED_JUMPTABLE);
        return;
      }
      this_01 = (DOMException *)__cxa_allocate_exception(0x28);
      DOMException::DOMException(this_01,4,0,this->fMemoryManager);
    }
  }
LAB_0027b22b:
  ppuVar9 = &DOMException::typeinfo;
  pcVar8 = DOMException::~DOMException;
LAB_0027b239:
  __cxa_throw(this_01,ppuVar9,pcVar8);
}

Assistant:

void DOMRangeImpl::insertNode(DOMNode* newNode)
{
    if (newNode == 0) return; //don't have to do anything

    if( fDetached) {
        throw DOMException(
            DOMException::INVALID_STATE_ERR, 0, fMemoryManager);
    }

    int type = newNode->getNodeType();
    if (type == DOMNode::ATTRIBUTE_NODE
        || type == DOMNode::ENTITY_NODE
        || type == DOMNode::NOTATION_NODE
        || type == DOMNode::DOCUMENT_NODE)
    {
        throw DOMRangeException(
            DOMRangeException::INVALID_NODE_TYPE_ERR, 0, fMemoryManager);
    }

    // Prevent cycles in the tree.
    //isKidOK() is not checked here as its taken care by insertBefore() function
    if (isAncestorOf( newNode, fStartContainer)) {
        throw DOMException(
            DOMException::HIERARCHY_REQUEST_ERR, 0, fMemoryManager);
    }

    for (DOMNode* aNode = fStartContainer; aNode!=0; aNode = aNode->getParentNode()) {
        if (castToNodeImpl(newNode)->isReadOnly()) {
        throw DOMException(
            DOMException::NO_MODIFICATION_ALLOWED_ERR, 0, fMemoryManager);
    }
    }

    if (fDocument != newNode->getOwnerDocument()) {
        throw DOMException(
            DOMException::WRONG_DOCUMENT_ERR, 0, fMemoryManager);
    }


    DOMNode* parent;
    DOMNode* next;

    type = fStartContainer->getNodeType();
    if((type == DOMNode::TEXT_NODE
        || type == DOMNode::CDATA_SECTION_NODE
        || type == DOMNode::COMMENT_NODE
        || type == DOMNode::PROCESSING_INSTRUCTION_NODE)) {

        //set 'parent' and 'next' here
        parent = fStartContainer->getParentNode();

        //split the text nodes
       if (fStartOffset > 0) {
           if (type == DOMNode::COMMENT_NODE)
               ((DOMCommentImpl*)fStartContainer)->splitText(fStartOffset);
           else if (type == DOMNode::PROCESSING_INSTRUCTION_NODE)
               ((DOMProcessingInstructionImpl*)fStartContainer)->splitText(fStartOffset);
           else
               ((DOMText*)fStartContainer)->splitText(fStartOffset);
       }

        //update the new start information later. After inserting the first newNode
        if (fStartOffset == 0)
            next = fStartContainer;
        else
            next = fStartContainer->getNextSibling();

    } // end of text handling
    else {
        parent = fStartContainer;

        next = fStartContainer->getFirstChild();
        for(XMLSize_t i = 0; (i < fStartOffset) && (next != 0); i++) {
            next=next->getNextSibling();
        }
    }

    if (parent != 0) {
        if (next != 0)
            parent->insertBefore(newNode, next);
        else
            parent->appendChild(newNode);
    }
}